

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O2

int mbedtls_x509_write_names(uchar **p,uchar *start,mbedtls_asn1_named_data *first)

{
  uchar *oid;
  uchar *text;
  size_t text_len;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  size_t len;
  size_t sVar5;
  
  len = 0;
  while( true ) {
    if (first == (mbedtls_asn1_named_data *)0x0) {
      iVar2 = mbedtls_asn1_write_len(p,start,len);
      iVar1 = iVar2;
      if ((-1 < iVar2) && (iVar1 = mbedtls_asn1_write_tag(p,start,'0'), -1 < iVar1)) {
        iVar1 = iVar2 + (int)len + iVar1;
      }
      return iVar1;
    }
    sVar5 = (first->oid).len;
    oid = (first->oid).p;
    text = (first->val).p;
    text_len = (first->val).len;
    if ((sVar5 == 9) && (iVar1 = bcmp(oid,anon_var_dwarf_7cd8,9), iVar1 == 0)) {
      iVar1 = mbedtls_asn1_write_ia5_string(p,start,(char *)text,text_len);
    }
    else {
      iVar1 = mbedtls_asn1_write_printable_string(p,start,(char *)text,text_len);
    }
    if (iVar1 < 0) {
      return iVar1;
    }
    iVar2 = mbedtls_asn1_write_oid(p,start,(char *)oid,sVar5);
    if (iVar2 < 0) {
      return iVar2;
    }
    uVar3 = mbedtls_asn1_write_len(p,start,(ulong)(uint)(iVar2 + iVar1));
    if ((int)uVar3 < 0) {
      return uVar3;
    }
    uVar4 = mbedtls_asn1_write_tag(p,start,'0');
    if ((int)uVar4 < 0) {
      return uVar4;
    }
    sVar5 = (ulong)(uint)(iVar2 + iVar1) + (ulong)uVar4 + (ulong)uVar3;
    iVar1 = mbedtls_asn1_write_len(p,start,sVar5);
    if (iVar1 < 0) {
      return iVar1;
    }
    iVar2 = mbedtls_asn1_write_tag(p,start,'1');
    if (iVar2 < 0) {
      return iVar2;
    }
    uVar3 = iVar1 + (int)sVar5 + iVar2;
    if ((int)uVar3 < 0) break;
    len = len + uVar3;
    first = first->next;
  }
  return uVar3;
}

Assistant:

int mbedtls_x509_write_names( unsigned char **p, unsigned char *start,
                      mbedtls_asn1_named_data *first )
{
    int ret;
    size_t len = 0;
    mbedtls_asn1_named_data *cur = first;

    while( cur != NULL )
    {
        MBEDTLS_ASN1_CHK_ADD( len, x509_write_name( p, start, (char *) cur->oid.p,
                                            cur->oid.len,
                                            cur->val.p, cur->val.len ) );
        cur = cur->next;
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_CONSTRUCTED |
                                                 MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}